

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_discard(mpack_reader_t *reader)

{
  mpack_error_t mVar1;
  mpack_tag_t mVar2;
  anon_union_8_8_6320e492_for_v local_20;
  mpack_tag_t var;
  mpack_reader_t *reader_local;
  
  mVar2 = mpack_read_tag(reader);
  local_20 = mVar2.v;
  mVar1 = mpack_reader_error(reader);
  if (mVar1 == mpack_ok) {
    switch(mVar2.type) {
    case mpack_type_str:
      mpack_skip_bytes(reader,local_20.u & 0xffffffff);
      mpack_done_str(reader);
      break;
    case mpack_type_bin:
      mpack_skip_bytes(reader,local_20.u & 0xffffffff);
      mpack_done_bin(reader);
      break;
    case mpack_type_ext:
      local_20._4_4_ = mVar2.v._4_4_;
      mpack_skip_bytes(reader,(ulong)(uint)local_20._4_4_);
      mpack_done_ext(reader);
      break;
    case mpack_type_array:
      while (local_20._0_4_ != 0) {
        mpack_discard(reader);
        mVar1 = mpack_reader_error(reader);
        if (mVar1 != mpack_ok) break;
        local_20.ext.length = 0;
        local_20.l = local_20._0_4_ - 1;
      }
      mpack_done_array(reader);
      break;
    case mpack_type_map:
      while (local_20._0_4_ != 0) {
        mpack_discard(reader);
        mpack_discard(reader);
        mVar1 = mpack_reader_error(reader);
        if (mVar1 != mpack_ok) break;
        local_20.ext.length = 0;
        local_20.l = local_20._0_4_ - 1;
      }
      mpack_done_map(reader);
    }
  }
  return;
}

Assistant:

void mpack_discard(mpack_reader_t* reader) {
    mpack_tag_t var = mpack_read_tag(reader);
    if (mpack_reader_error(reader))
        return;
    switch (var.type) {
        case mpack_type_str:
            mpack_skip_bytes(reader, var.v.l);
            mpack_done_str(reader);
            break;
        case mpack_type_bin:
            mpack_skip_bytes(reader, var.v.l);
            mpack_done_bin(reader);
            break;
        case mpack_type_ext:
            mpack_skip_bytes(reader, var.v.ext.length);
            mpack_done_ext(reader);
            break;
        case mpack_type_array: {
            for (; var.v.n > 0; --var.v.n) {
                mpack_discard(reader);
                if (mpack_reader_error(reader))
                    break;
            }
            mpack_done_array(reader);
            break;
        }
        case mpack_type_map: {
            for (; var.v.n > 0; --var.v.n) {
                mpack_discard(reader);
                mpack_discard(reader);
                if (mpack_reader_error(reader))
                    break;
            }
            mpack_done_map(reader);
            break;
        }
        default:
            break;
    }
}